

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::AttributeLocationTestUtil::AttribType::AttribType
          (AttribType *this,string *name,deUint32 localSize,deUint32 typeEnum)

{
  deUint32 typeEnum_local;
  deUint32 localSize_local;
  string *name_local;
  AttribType *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->m_locationSize = localSize;
  this->m_glTypeEnum = typeEnum;
  return;
}

Assistant:

AttribType::AttribType (const string& name, deUint32 localSize, deUint32 typeEnum)
	: m_name			(name)
	, m_locationSize	(localSize)
	, m_glTypeEnum		(typeEnum)
{
}